

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadDylink0Section(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  uint32_t uVar3;
  undefined1 local_130 [8];
  string_view name;
  uint32_t flags_1;
  Index i_1;
  undefined1 local_e0 [8];
  string_view field;
  string_view module;
  uint32_t flags;
  Index i;
  undefined1 local_98 [8];
  string_view so_name;
  uint local_64;
  uint local_60;
  uint32_t table_align;
  uint32_t table_size;
  uint32_t mem_align;
  uint32_t mem_size;
  uint32_t count;
  ReadEndRestoreGuard guard;
  size_t subsection_end;
  Offset local_30;
  Offset subsection_size;
  uint32_t dylink_type;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _dylink_type = section_size;
  section_size_local = (Offset)this;
  subsection_size._4_4_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])();
  bVar1 = Succeeded(subsection_size._4_4_);
  if (bVar1) {
    do {
      if (this->read_end_ <= (this->state_).offset) {
        RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc1])();
        bVar1 = Succeeded(RVar2);
        if (!bVar1) {
          PrintError(this,"EndDylinkSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        Result::Result((Result *)((long)&this_local + 4),Ok);
        return (Result)this_local._4_4_;
      }
      RVar2 = ReadU32Leb128(this,(uint32_t *)&subsection_size,"type");
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      RVar2 = ReadOffset(this,&local_30,"subsection size");
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      guard.previous_value_ = (this->state_).offset + local_30;
      if (this->read_end_ < guard.previous_value_) {
        PrintError(this,"invalid sub-section size: extends past end");
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
      ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                         *)&mem_size,this);
      this->read_end_ = guard.previous_value_;
      switch((undefined4)subsection_size) {
      case 1:
        RVar2 = ReadU32Leb128(this,&table_size,"mem_size");
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          RVar2 = ReadU32Leb128(this,&table_align,"mem_align");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            RVar2 = ReadU32Leb128(this,&local_60,"table_size");
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              bVar1 = true;
            }
            else {
              RVar2 = ReadU32Leb128(this,&local_64,"table_align");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
              else {
                RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])
                                        (this->delegate_,(ulong)table_size,(ulong)table_align,
                                         (ulong)local_60,(ulong)local_64);
                bVar1 = Succeeded(RVar2);
                if (bVar1) goto LAB_00204ecd;
                PrintError(this,"OnDylinkInfo callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
              }
            }
          }
        }
        break;
      case 2:
        RVar2 = ReadU32Leb128(this,&mem_align,"needed_dynlibs");
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          so_name._M_str._4_4_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])();
          bVar1 = Succeeded(so_name._M_str._4_4_);
          if (bVar1) {
            do {
              uVar3 = mem_align - 1;
              bVar1 = mem_align == 0;
              mem_align = uVar3;
              if (bVar1) goto LAB_00204ecd;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_98);
              RVar2 = ReadStr(this,(string_view *)local_98,"dylib so_name");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_00204f1d;
              }
              RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc0])
                                      (this->delegate_,local_98,so_name._M_len);
              bVar1 = Succeeded(RVar2);
            } while (bVar1);
            PrintError(this,"OnDylinkNeeded callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
          else {
            PrintError(this,"OnDylinkNeededCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            bVar1 = true;
          }
        }
        break;
      case 3:
        RVar2 = ReadU32Leb128(this,&mem_align,"count");
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbc])();
          bVar1 = Succeeded(RVar2);
          if (bVar1) {
            for (name._M_str._4_4_ = 0; name._M_str._4_4_ < mem_align;
                name._M_str._4_4_ = name._M_str._4_4_ + 1) {
              name._M_str._0_4_ = 0;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_130);
              RVar2 = ReadStr(this,(string_view *)local_130,"name");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_00204f1d;
              }
              RVar2 = ReadU32Leb128(this,(uint32_t *)&name._M_str,"flags");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_00204f1d;
              }
              RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbe])
                                      (this->delegate_,local_130,name._M_len,
                                       (ulong)(uint)name._M_str);
              bVar1 = Succeeded(RVar2);
              if (!bVar1) {
                PrintError(this,"OnDylinkExport callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_00204f1d;
              }
            }
            goto LAB_00204ecd;
          }
          PrintError(this,"OnDylinkExportCount callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        break;
      case 4:
        RVar2 = ReadU32Leb128(this,&mem_align,"count");
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        else {
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbb])();
          bVar1 = Succeeded(RVar2);
          if (bVar1) {
            for (module._M_str._4_4_ = 0; module._M_str._4_4_ < mem_align;
                module._M_str._4_4_ = module._M_str._4_4_ + 1) {
              module._M_str._0_4_ = 0;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&field._M_str);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_e0);
              RVar2 = ReadStr(this,(string_view *)&field._M_str,"module");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_00204f1d;
              }
              RVar2 = ReadStr(this,(string_view *)local_e0,"field");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_00204f1d;
              }
              RVar2 = ReadU32Leb128(this,(uint32_t *)&module._M_str,"flags");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_00204f1d;
              }
              RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbd])
                                      (this->delegate_,field._M_str,module._M_len,local_e0,
                                       field._M_len,(ulong)(uint)module._M_str);
              bVar1 = Succeeded(RVar2);
              if (!bVar1) {
                PrintError(this,"OnDylinkImport callback failed");
                Result::Result((Result *)((long)&this_local + 4),Error);
                bVar1 = true;
                goto LAB_00204f1d;
              }
            }
            goto LAB_00204ecd;
          }
          PrintError(this,"OnDylinkImportCount callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
        break;
      default:
        (this->state_).offset = guard.previous_value_;
LAB_00204ecd:
        if ((this->state_).offset == guard.previous_value_) {
          bVar1 = false;
        }
        else {
          PrintError(this,"unfinished sub-section (expected end: 0x%zx)",guard.previous_value_);
          Result::Result((Result *)((long)&this_local + 4),Error);
          bVar1 = true;
        }
      }
LAB_00204f1d:
      ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
      ~ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                          *)&mem_size);
    } while (!bVar1);
  }
  else {
    PrintError(this,"BeginDylinkSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadDylink0Section(Offset section_size) {
  CALLBACK(BeginDylinkSection, section_size);

  while (state_.offset < read_end_) {
    uint32_t dylink_type;
    Offset subsection_size;
    CHECK_RESULT(ReadU32Leb128(&dylink_type, "type"));
    CHECK_RESULT(ReadOffset(&subsection_size, "subsection size"));
    size_t subsection_end = state_.offset + subsection_size;
    ERROR_UNLESS(subsection_end <= read_end_,
                 "invalid sub-section size: extends past end");
    ReadEndRestoreGuard guard(this);
    read_end_ = subsection_end;

    uint32_t count;
    switch (static_cast<DylinkEntryType>(dylink_type)) {
      case DylinkEntryType::MemInfo: {
        uint32_t mem_size;
        uint32_t mem_align;
        uint32_t table_size;
        uint32_t table_align;

        CHECK_RESULT(ReadU32Leb128(&mem_size, "mem_size"));
        CHECK_RESULT(ReadU32Leb128(&mem_align, "mem_align"));
        CHECK_RESULT(ReadU32Leb128(&table_size, "table_size"));
        CHECK_RESULT(ReadU32Leb128(&table_align, "table_align"));
        CALLBACK(OnDylinkInfo, mem_size, mem_align, table_size, table_align);
        break;
      }
      case DylinkEntryType::Needed:
        CHECK_RESULT(ReadU32Leb128(&count, "needed_dynlibs"));
        CALLBACK(OnDylinkNeededCount, count);
        while (count--) {
          std::string_view so_name;
          CHECK_RESULT(ReadStr(&so_name, "dylib so_name"));
          CALLBACK(OnDylinkNeeded, so_name);
        }
        break;
      case DylinkEntryType::ImportInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "count"));
        CALLBACK(OnDylinkImportCount, count);
        for (Index i = 0; i < count; ++i) {
          uint32_t flags = 0;
          std::string_view module;
          std::string_view field;
          CHECK_RESULT(ReadStr(&module, "module"));
          CHECK_RESULT(ReadStr(&field, "field"));
          CHECK_RESULT(ReadU32Leb128(&flags, "flags"));
          CALLBACK(OnDylinkImport, module, field, flags);
        }
        break;
      case DylinkEntryType::ExportInfo:
        CHECK_RESULT(ReadU32Leb128(&count, "count"));
        CALLBACK(OnDylinkExportCount, count);
        for (Index i = 0; i < count; ++i) {
          uint32_t flags = 0;
          std::string_view name;
          CHECK_RESULT(ReadStr(&name, "name"));
          CHECK_RESULT(ReadU32Leb128(&flags, "flags"));
          CALLBACK(OnDylinkExport, name, flags);
        }
        break;
      default:
        // Unknown subsection, skip it.
        state_.offset = subsection_end;
        break;
    }
    ERROR_UNLESS(state_.offset == subsection_end,
                 "unfinished sub-section (expected end: 0x%" PRIzx ")",
                 subsection_end);
  }

  CALLBACK0(EndDylinkSection);
  return Result::Ok;
}